

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literal * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::truncSFloat
          (Literal *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,Unary *curr,
          Literal *value)

{
  uintptr_t uVar1;
  char cVar2;
  int32_t iVar3;
  int64_t iVar4;
  double dVar5;
  uintptr_t uStack_40;
  
  dVar5 = (double)wasm::Literal::getFloat();
  if (NAN(dVar5)) {
    (*this->_vptr_ExpressionRunner[2])(this,"truncSFloat of nan");
  }
  uVar1 = (value->type).id;
  if (*(long *)(curr + 8) == 2) {
    if (uVar1 == 4) {
      iVar3 = Literal::reinterpreti32(value);
      cVar2 = wasm::isInRangeI32TruncS(iVar3);
    }
    else {
      iVar4 = Literal::reinterpreti64(value);
      cVar2 = wasm::isInRangeI32TruncS(iVar4);
    }
    if (cVar2 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i32.truncSFloat overflow");
    }
    (__return_storage_ptr__->field_0).i32 = (int)dVar5;
    uStack_40 = 2;
  }
  else {
    if (uVar1 == 4) {
      iVar3 = Literal::reinterpreti32(value);
      cVar2 = wasm::isInRangeI64TruncS(iVar3);
    }
    else {
      iVar4 = Literal::reinterpreti64(value);
      cVar2 = wasm::isInRangeI64TruncS(iVar4);
    }
    if (cVar2 == '\0') {
      (*this->_vptr_ExpressionRunner[2])(this,"i64.truncSFloat overflow");
    }
    (__return_storage_ptr__->field_0).i64 = (long)dVar5;
    uStack_40 = 3;
  }
  (__return_storage_ptr__->type).id = uStack_40;
  return __return_storage_ptr__;
}

Assistant:

Literal truncSFloat(Unary* curr, Literal value) {
    double val = value.getFloat();
    if (std::isnan(val)) {
      trap("truncSFloat of nan");
    }
    if (curr->type == Type::i32) {
      if (value.type == Type::f32) {
        if (!isInRangeI32TruncS(value.reinterpreti32())) {
          trap("i32.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI32TruncS(value.reinterpreti64())) {
          trap("i32.truncSFloat overflow");
        }
      }
      return Literal(int32_t(val));
    } else {
      if (value.type == Type::f32) {
        if (!isInRangeI64TruncS(value.reinterpreti32())) {
          trap("i64.truncSFloat overflow");
        }
      } else {
        if (!isInRangeI64TruncS(value.reinterpreti64())) {
          trap("i64.truncSFloat overflow");
        }
      }
      return Literal(int64_t(val));
    }
  }